

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Array<unsigned_long> * __thiscall
capnp::Schema::getGenericScopeIds(Array<unsigned_long> *__return_storage_ptr__,Schema *this)

{
  unsigned_long *puVar1;
  Scope *pSVar2;
  unsigned_long iScope;
  ulong uVar3;
  Iterator __end1;
  ulong elementCount;
  StructReader SStack_68;
  PointerReader local_38;
  
  local_38.pointer = (WirePointer *)this->raw->generic->encodedNode;
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&SStack_68,&local_38,(word *)0x0);
  if ((SStack_68.dataSize < 0x121) || ((*(byte *)((long)SStack_68.data + 0x24) & 1) == 0)) {
    __return_storage_ptr__->ptr = (unsigned_long *)0x0;
    __return_storage_ptr__->size_ = 0;
    __return_storage_ptr__->disposer = (ArrayDisposer *)0x0;
  }
  else {
    elementCount = (ulong)this->raw->scopeCount;
    puVar1 = (unsigned_long *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    __return_storage_ptr__->ptr = puVar1;
    __return_storage_ptr__->size_ = elementCount;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    if (elementCount != 0) {
      pSVar2 = this->raw->scopes;
      uVar3 = 0;
      do {
        puVar1[uVar3] = pSVar2->typeId;
        uVar3 = uVar3 + 1;
        pSVar2 = pSVar2 + 1;
      } while (elementCount != uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<uint64_t> Schema::getGenericScopeIds() const {
  if (!getProto().getIsGeneric())
    return nullptr;

  auto result = kj::heapArray<uint64_t>(raw->scopeCount);
  for (auto iScope: kj::indices(result)) {
    result[iScope] = raw->scopes[iScope].typeId;
  }

  return result;
}